

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

UniValue * AddrmanEntryToJSON(UniValue *__return_storage_ptr__,AddrInfo *info,CConnman *connman)

{
  string str;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  uint16_t uVar1;
  Network NVar2;
  uint32_t uVar3;
  CNetAddr *this;
  long in_FS_OFFSET;
  undefined4 uStack_4a8;
  uint32_t mapped_as;
  undefined1 local_4a0 [24];
  UniValue in_stack_fffffffffffffb78;
  UniValue local_428;
  string local_3d0 [32];
  UniValue local_3b0;
  string local_358 [32];
  UniValue local_338;
  string local_2e0 [32];
  UniValue local_2c0;
  string local_268 [32];
  UniValue local_248;
  string local_1f0 [32];
  UniValue local_1d0;
  string local_178 [32];
  UniValue local_158;
  string local_100 [32];
  uint32_t source_mapped_as;
  undefined4 uStack_dc;
  UniValue local_c0;
  string local_68 [32];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  str._M_dataplus._M_p._4_4_ = mapped_as;
  str._M_dataplus._M_p._0_4_ = uStack_4a8;
  str._8_24_ = local_4a0;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"address",(allocator<char> *)&mapped_as);
  CNetAddr::ToStringAddr_abi_cxx11_((string *)&source_mapped_as,(CNetAddr *)info);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source_mapped_as)
  ;
  key._M_dataplus._M_p._4_4_ = mapped_as;
  key._M_dataplus._M_p._0_4_ = uStack_4a8;
  key._M_string_length = local_4a0._0_8_;
  key.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )local_4a0._8_16_;
  UniValue::pushKV(__return_storage_ptr__,key,in_stack_fffffffffffffb78);
  UniValue::~UniValue(&local_c0);
  std::__cxx11::string::~string((string *)&source_mapped_as);
  std::__cxx11::string::~string(local_68);
  mapped_as = CConnman::GetMappedAS(connman,(CNetAddr *)info);
  if (mapped_as != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_100,"mapped_as",(allocator<char> *)&source_mapped_as);
    UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(&local_158,&mapped_as);
    key_00._M_dataplus._M_p._4_4_ = mapped_as;
    key_00._M_dataplus._M_p._0_4_ = uStack_4a8;
    key_00._M_string_length = local_4a0._0_8_;
    key_00.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )local_4a0._8_16_;
    UniValue::pushKV(__return_storage_ptr__,key_00,in_stack_fffffffffffffb78);
    UniValue::~UniValue(&local_158);
    std::__cxx11::string::~string(local_100);
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"port",(allocator<char> *)((long)&uStack_4a8 + 3));
  uVar1 = CService::GetPort((CService *)info);
  source_mapped_as._0_2_ = uVar1;
  UniValue::UniValue<unsigned_short,_unsigned_short,_true>
            (&local_1d0,(unsigned_short *)&source_mapped_as);
  key_01._M_dataplus._M_p._4_4_ = mapped_as;
  key_01._M_dataplus._M_p._0_4_ = uStack_4a8;
  key_01._M_string_length = local_4a0._0_8_;
  key_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )local_4a0._8_16_;
  UniValue::pushKV(__return_storage_ptr__,key_01,in_stack_fffffffffffffb78);
  UniValue::~UniValue(&local_1d0);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f0,"services",(allocator<char> *)((long)&uStack_4a8 + 3));
  _source_mapped_as = (pointer)(info->super_CAddress).nServices;
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>
            (&local_248,(unsigned_long *)&source_mapped_as);
  key_02._M_dataplus._M_p._4_4_ = mapped_as;
  key_02._M_dataplus._M_p._0_4_ = uStack_4a8;
  key_02._M_string_length = local_4a0._0_8_;
  key_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )local_4a0._8_16_;
  UniValue::pushKV(__return_storage_ptr__,key_02,in_stack_fffffffffffffb78);
  UniValue::~UniValue(&local_248);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_268,"time",(allocator<char> *)((long)&uStack_4a8 + 3));
  _source_mapped_as = (pointer)(info->super_CAddress).nTime.__d.__r;
  UniValue::UniValue<long,_long,_true>(&local_2c0,(long *)&source_mapped_as);
  key_03._M_dataplus._M_p._4_4_ = mapped_as;
  key_03._M_dataplus._M_p._0_4_ = uStack_4a8;
  key_03._M_string_length = local_4a0._0_8_;
  key_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )local_4a0._8_16_;
  UniValue::pushKV(__return_storage_ptr__,key_03,in_stack_fffffffffffffb78);
  UniValue::~UniValue(&local_2c0);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e0,"network",(allocator<char> *)((long)&uStack_4a8 + 3));
  NVar2 = CNetAddr::GetNetClass((CNetAddr *)info);
  GetNetworkName_abi_cxx11_((string *)&source_mapped_as,NVar2);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_338,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source_mapped_as)
  ;
  key_04._M_dataplus._M_p._4_4_ = mapped_as;
  key_04._M_dataplus._M_p._0_4_ = uStack_4a8;
  key_04._M_string_length = local_4a0._0_8_;
  key_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )local_4a0._8_16_;
  UniValue::pushKV(__return_storage_ptr__,key_04,in_stack_fffffffffffffb78);
  UniValue::~UniValue(&local_338);
  std::__cxx11::string::~string((string *)&source_mapped_as);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,"source",(allocator<char> *)((long)&uStack_4a8 + 3));
  this = &info->source;
  CNetAddr::ToStringAddr_abi_cxx11_((string *)&source_mapped_as,this);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source_mapped_as)
  ;
  key_05._M_dataplus._M_p._4_4_ = mapped_as;
  key_05._M_dataplus._M_p._0_4_ = uStack_4a8;
  key_05._M_string_length = local_4a0._0_8_;
  key_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )local_4a0._8_16_;
  UniValue::pushKV(__return_storage_ptr__,key_05,in_stack_fffffffffffffb78);
  UniValue::~UniValue(&local_3b0);
  std::__cxx11::string::~string((string *)&source_mapped_as);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d0,"source_network",(allocator<char> *)((long)&uStack_4a8 + 3));
  NVar2 = CNetAddr::GetNetClass(this);
  GetNetworkName_abi_cxx11_((string *)&source_mapped_as,NVar2);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_428,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source_mapped_as)
  ;
  key_06._M_dataplus._M_p._4_4_ = mapped_as;
  key_06._M_dataplus._M_p._0_4_ = uStack_4a8;
  key_06._M_string_length = local_4a0._0_8_;
  key_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )local_4a0._8_16_;
  UniValue::pushKV(__return_storage_ptr__,key_06,in_stack_fffffffffffffb78);
  UniValue::~UniValue(&local_428);
  std::__cxx11::string::~string((string *)&source_mapped_as);
  std::__cxx11::string::~string(local_3d0);
  uVar3 = CConnman::GetMappedAS(connman,this);
  source_mapped_as = uVar3;
  if (uVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffbb8,"source_mapped_as",
               (allocator<char> *)((long)&uStack_4a8 + 3));
    UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>
              ((UniValue *)local_4a0,&source_mapped_as);
    key_07._M_dataplus._M_p._4_4_ = mapped_as;
    key_07._M_dataplus._M_p._0_4_ = uStack_4a8;
    key_07._M_string_length = local_4a0._0_8_;
    key_07.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )local_4a0._8_16_;
    UniValue::pushKV(__return_storage_ptr__,key_07,in_stack_fffffffffffffb78);
    UniValue::~UniValue((UniValue *)local_4a0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue AddrmanEntryToJSON(const AddrInfo& info, CConnman& connman)
{
    UniValue ret(UniValue::VOBJ);
    ret.pushKV("address", info.ToStringAddr());
    const auto mapped_as{connman.GetMappedAS(info)};
    if (mapped_as != 0) {
        ret.pushKV("mapped_as", mapped_as);
    }
    ret.pushKV("port", info.GetPort());
    ret.pushKV("services", (uint64_t)info.nServices);
    ret.pushKV("time", int64_t{TicksSinceEpoch<std::chrono::seconds>(info.nTime)});
    ret.pushKV("network", GetNetworkName(info.GetNetClass()));
    ret.pushKV("source", info.source.ToStringAddr());
    ret.pushKV("source_network", GetNetworkName(info.source.GetNetClass()));
    const auto source_mapped_as{connman.GetMappedAS(info.source)};
    if (source_mapped_as != 0) {
        ret.pushKV("source_mapped_as", source_mapped_as);
    }
    return ret;
}